

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
QueryCompiler::compileViews
          (QueryCompiler *this,TDNode *node,size_t destinationID,
          vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *aggregate,
          var_bitset freeVars)

{
  pointer *ppbVar1;
  pointer *pppVar2;
  _WordT *p_Var3;
  ulong *puVar4;
  pointer ppFVar5;
  Function *pFVar6;
  ulong uVar7;
  ulong uVar8;
  iterator __position;
  ulong uVar9;
  iterator __position_00;
  _Hash_node_base *p_Var10;
  iterator __position_01;
  iterator __position_02;
  pointer ppVVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  Aggregate *pAVar15;
  TDNode *pTVar16;
  _WordT _Var17;
  iterator iVar18;
  pointer pbVar19;
  iterator iVar20;
  mapped_type *pmVar21;
  bitset<200UL> *this_00;
  iterator iVar22;
  View *pVVar23;
  mapped_type *pmVar24;
  mapped_type *pmVar25;
  ulong uVar26;
  pointer pbVar27;
  bool bVar28;
  long lVar29;
  bitset<1500UL> *pbVar30;
  size_t other;
  unsigned_long uVar31;
  bitset<1500UL> *pbVar32;
  pointer __src;
  ulong uVar33;
  pointer ppAVar34;
  size_t sVar35;
  long lVar36;
  size_type __n;
  ulong uVar37;
  ulong uVar38;
  pointer pbVar39;
  pointer __src_00;
  unsigned_long uVar40;
  ulong uVar41;
  pointer ppVVar42;
  bool bVar43;
  long lVar44;
  char cVar45;
  ushort uVar46;
  byte bVar57;
  char cVar58;
  byte bVar59;
  char cVar60;
  byte bVar61;
  char cVar62;
  byte bVar63;
  char cVar64;
  byte bVar65;
  undefined1 auVar55 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  pair<unsigned_long,_unsigned_long> pVar68;
  var_bitset freeVars_00;
  initializer_list<std::bitset<1500UL>_> __l;
  Aggregate *agg;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> pushDownMask;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> pushDownFreeVars;
  prod_bitset forcedLocal;
  agg_bitset candidate;
  agg_bitset merges;
  View *view;
  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
  localAggMap;
  bitset<1500UL> __result_5;
  prod_bitset localMask;
  prod_bitset presentFunctions;
  prod_bitset forcedLocalFunctions;
  prod_bitset remainderMask;
  ulong local_890;
  Aggregate *local_868;
  size_t local_860;
  TDNode *local_858;
  value_type local_850;
  ulong local_840;
  bitset<1500UL> *local_838;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_830;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_818;
  _Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_800;
  _Hash_node_base *local_7f8;
  Aggregate *local_7f0;
  ulong local_7e8;
  ulong local_7e0;
  size_t local_7d8;
  ulong local_7d0;
  ulong local_7c8;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> local_7c0;
  undefined1 local_7a8 [16];
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_798;
  size_t local_780;
  ulong local_6f0;
  bitset<200UL> local_6e8;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  key_type local_6a0;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  undefined1 local_5b8 [16];
  key_type local_5a8;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  View *local_4b0;
  ulong auStack_4a8 [23];
  bitset<1500UL> local_3f0;
  ulong local_330 [24];
  bitset<1500UL> local_270;
  ulong local_1b0 [24];
  bitset<1500UL> local_f0;
  undefined4 uVar47;
  undefined6 uVar48;
  undefined8 uVar49;
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [16];
  undefined1 auVar56 [16];
  
  local_850.super__Base_bitset<2UL>._M_w[1] = freeVars.super__Base_bitset<2UL>._M_w[1];
  local_850.super__Base_bitset<2UL>._M_w[0] = freeVars.super__Base_bitset<2UL>._M_w[0];
  local_7a8 = (undefined1  [16])freeVars.super__Base_bitset<2UL>._M_w;
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
            (&local_798,aggregate);
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  ._44_4_ = *(undefined4 *)&node->_id;
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Head_base<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_false>
  ._M_head_impl.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_798.
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_798.
                         super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .super__Tuple_impl<3UL,_std::bitset<100UL>_>.super__Head_base<3UL,_std::bitset<100UL>,_false>.
  _M_head_impl.super__Base_bitset<2UL>._M_w[0] = local_7a8._0_8_;
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .super__Tuple_impl<3UL,_std::bitset<100UL>_>.super__Head_base<3UL,_std::bitset<100UL>,_false>.
  _M_head_impl.super__Base_bitset<2UL>._M_w[1] = local_7a8._8_8_;
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Head_base<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_false>
  ._M_head_impl.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_798.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Head_base<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_false>
  ._M_head_impl.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_798.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_5a8.
  super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .
  super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  .super__Head_base<1UL,_int,_false>._M_head_impl = (int)destinationID;
  local_800 = (_Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->_cache;
  local_860 = destinationID;
  local_780 = destinationID;
  iVar18 = std::
           _Hashtable<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_800,&local_5a8);
  if (iVar18.
      super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
              (&local_818,node->_numOfNeighbors,(allocator_type *)local_7a8);
    memset(&local_3f0,0,0xc0);
    memset(local_330 + 0x18,0,0xc0);
    memset(&local_f0,0,0xc0);
    memset(local_330,0,0xc0);
    pbVar19 = (aggregate->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pbVar39 = (aggregate->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    __n = ((long)pbVar39 - (long)pbVar19 >> 6) * -0x5555555555555555;
    if (pbVar39 != pbVar19) {
      lVar29 = 0;
      do {
        lVar36 = 0;
        do {
          p_Var3 = (pbVar19->super__Base_bitset<24UL>)._M_w + lVar36;
          uVar26 = p_Var3[1];
          local_330[lVar36] = local_330[lVar36] | *p_Var3;
          local_330[lVar36 + 1] = local_330[lVar36 + 1] | uVar26;
          lVar36 = lVar36 + 2;
        } while (lVar36 != 0x18);
        lVar29 = lVar29 + 1;
        pbVar19 = pbVar19 + 1;
      } while (lVar29 != __n + (__n == 0));
    }
    ppFVar5 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar26 = 0;
    do {
      uVar37 = uVar26 >> 6;
      uVar38 = 1L << ((byte)uVar26 & 0x3f);
      if ((local_330[uVar37] >> (uVar26 & 0x3f) & 1) != 0) {
        pFVar6 = ppFVar5[uVar26];
        uVar33 = (pFVar6->_fVars).super__Base_bitset<2UL>._M_w[0];
        uVar7 = *(_WordT *)((long)(pFVar6->_fVars).super__Base_bitset<2UL>._M_w + 8);
        bVar28 = true;
        lVar29 = 0;
        uVar9 = (node->_bag).super__Base_bitset<2UL>._M_w[0] & uVar33;
        do {
          uVar41 = uVar9;
          uVar8 = *(ulong *)((long)(pFVar6->_fVars).super__Base_bitset<2UL>._M_w + lVar29 * 8);
          if (!bVar28) break;
          lVar29 = 1;
          bVar28 = false;
          uVar9 = (node->_bag).super__Base_bitset<2UL>._M_w[1] & uVar7;
        } while (uVar41 == uVar8);
        pbVar32 = &local_3f0;
        if (uVar41 != uVar8) {
          pbVar30 = &local_3f0;
          pbVar32 = (bitset<1500UL> *)(local_330 + 0x18);
          if (node->_numOfNeighbors != 0) {
            sVar35 = 0;
            do {
              if ((node->_neighbors).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar35] != local_860) {
                bVar28 = true;
                lVar29 = 0;
                uVar9 = node->_neighborSchema[sVar35].super__Base_bitset<2UL>._M_w[0] & uVar33;
                do {
                  uVar41 = uVar9;
                  uVar8 = *(ulong *)((long)(pFVar6->_fVars).super__Base_bitset<2UL>._M_w +
                                    lVar29 * 8);
                  if (!bVar28) break;
                  lVar29 = 1;
                  bVar28 = false;
                  uVar9 = node->_neighborSchema[sVar35].super__Base_bitset<2UL>._M_w[1] & uVar7;
                } while (uVar41 == uVar8);
                if (uVar41 == uVar8) {
                  pbVar30 = local_818.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + sVar35;
                  pbVar32 = &local_f0;
                  goto LAB_0029c0e3;
                }
              }
              sVar35 = sVar35 + 1;
            } while (sVar35 != node->_numOfNeighbors);
            pbVar30 = &local_3f0;
            pbVar32 = (bitset<1500UL> *)(local_330 + 0x18);
          }
LAB_0029c0e3:
          p_Var3 = (pbVar30->super__Base_bitset<24UL>)._M_w + uVar37;
          *p_Var3 = *p_Var3 | uVar38;
        }
        p_Var3 = (pbVar32->super__Base_bitset<24UL>)._M_w + uVar37;
        *p_Var3 = *p_Var3 | uVar38;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != 0x5dc);
    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::vector
              (&local_7c0,__n,&local_850,(allocator_type *)local_7a8);
    local_5e0._0_8_ = local_5b8 + 8;
    local_5e0._8_8_ = 1;
    local_5d0 = (undefined1  [16])0x0;
    local_5c0 = 1.0;
    local_5b8 = (undefined1  [16])0x0;
    pbVar19 = (aggregate->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((aggregate->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pbVar19) {
      uVar26 = 0;
      do {
        memcpy(local_7a8,pbVar19 + uVar26,0xc0);
        lVar29 = 0;
        do {
          uVar37 = local_330[lVar29 + 0x19];
          uVar38 = *(ulong *)(local_7a8 + lVar29 * 8 + 8);
          *(ulong *)(local_7a8 + lVar29 * 8) =
               *(ulong *)(local_7a8 + lVar29 * 8) & local_330[lVar29 + 0x18];
          *(ulong *)(local_7a8 + lVar29 * 8 + 8) = uVar38 & uVar37;
          lVar29 = lVar29 + 2;
        } while (lVar29 != 0x18);
        ppFVar5 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pbVar27 = local_7c0.
                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar26;
        uVar37 = 0;
        do {
          if ((*(ulong *)(local_7a8 + (uVar37 >> 6) * 8) >> (uVar37 & 0x3f) & 1) != 0) {
            pFVar6 = ppFVar5[uVar37];
            uVar38 = (node->_bag).super__Base_bitset<2UL>._M_w[1];
            uVar7 = *(_WordT *)((long)(pFVar6->_fVars).super__Base_bitset<2UL>._M_w + 8);
            uVar33 = (pbVar27->super__Base_bitset<2UL>)._M_w[1];
            (pbVar27->super__Base_bitset<2UL>)._M_w[0] =
                 (pbVar27->super__Base_bitset<2UL>)._M_w[0] |
                 (pFVar6->_fVars).super__Base_bitset<2UL>._M_w[0] &
                 ((node->_bag).super__Base_bitset<2UL>._M_w[0] ^ 0xffffffffffffffff);
            (pbVar27->super__Base_bitset<2UL>)._M_w[1] =
                 uVar33 | uVar7 & (uVar38 & 0xfffffffff ^ 0xfffffffff);
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 != 0x5dc);
        memcpy(&local_6a0,pbVar19 + uVar26,0xc0);
        lVar29 = 0;
        do {
          uVar37 = local_3f0.super__Base_bitset<24UL>._M_w[lVar29 + 1];
          uVar38 = local_6a0.super__Base_bitset<24UL>._M_w[lVar29 + 1];
          local_6a0.super__Base_bitset<24UL>._M_w[lVar29] =
               local_6a0.super__Base_bitset<24UL>._M_w[lVar29] &
               local_3f0.super__Base_bitset<24UL>._M_w[lVar29];
          local_6a0.super__Base_bitset<24UL>._M_w[lVar29 + 1] = uVar38 & uVar37;
          lVar29 = lVar29 + 2;
        } while (lVar29 != 0x18);
        iVar20 = std::
                 _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_5e0,&local_6a0);
        if (iVar20.
            super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_568 = (undefined1  [16])0x0;
          local_578 = (undefined1  [16])0x0;
          if (199 < uVar26) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar26,
                       200);
          }
          *(ulong *)(local_578 + (uVar26 >> 6) * 8) =
               *(ulong *)(local_578 + (uVar26 >> 6) * 8) | 1L << ((byte)uVar26 & 0x3f);
          pmVar21 = std::__detail::
                    _Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_5e0,&local_6a0);
          (pmVar21->super__Base_bitset<4UL>)._M_w[2] = local_568._0_8_;
          (pmVar21->super__Base_bitset<4UL>)._M_w[3] = local_568._8_8_;
          (pmVar21->super__Base_bitset<4UL>)._M_w[0] = local_578._0_8_;
          (pmVar21->super__Base_bitset<4UL>)._M_w[1] = local_578._8_8_;
        }
        else {
          if (199 < uVar26) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar26,
                       200);
          }
          puVar4 = (ulong *)((long)iVar20.
                                   super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
                                   ._M_cur + 200 + (uVar26 >> 6) * 8);
          *puVar4 = *puVar4 | 1L << ((byte)uVar26 & 0x3f);
        }
        uVar26 = uVar26 + 1;
        pbVar19 = (aggregate->
                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar26 < (ulong)(((long)(aggregate->
                                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19
                                >> 6) * -0x5555555555555555));
    }
    local_868 = (Aggregate *)operator_new(0x30);
    (local_868->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_868->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined1 (*) [16])
     &(local_868->_agg).
      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (local_868->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_868->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var10 = (_Hash_node_base *)local_5d0._0_8_;
    while (p_Var10 != (_Hash_node_base *)0x0) {
      local_838 = (bitset<1500UL> *)(p_Var10 + 1);
      this_00 = (bitset<200UL> *)(p_Var10 + 0x19);
      uVar26 = 0;
      local_7f8 = p_Var10;
      do {
        pAVar15 = local_868;
        if (((this_00->super__Base_bitset<4UL>)._M_w[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) != 0) {
          __position._M_current =
               (local_868->_agg).
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_868->_agg).
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
            _M_realloc_insert<std::bitset<1500ul>const&>
                      ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)local_868,
                       __position,local_838);
          }
          else {
            memcpy(__position._M_current,local_838,0xc0);
            ppbVar1 = &(pAVar15->_agg).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppbVar1 = *ppbVar1 + 1;
          }
          local_6b8 = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6e8.super__Base_bitset<4UL>._M_w[2] = (_WordT)p_Var10[0x1b]._M_nxt;
          local_6e8.super__Base_bitset<4UL>._M_w[3] = (_WordT)p_Var10[0x1c]._M_nxt;
          local_6e8.super__Base_bitset<4UL>._M_w[0] = (this_00->super__Base_bitset<4UL>)._M_w[0];
          local_6e8.super__Base_bitset<4UL>._M_w[1] = (_WordT)p_Var10[0x1a]._M_nxt;
          lVar36 = 0;
          lVar44 = 0;
          lVar29 = 0;
          do {
            auVar55 = *(undefined1 (*) [16])((this_00->super__Base_bitset<4UL>)._M_w + lVar29);
            auVar66._0_2_ = auVar55._0_2_ >> 1;
            auVar66._2_2_ = auVar55._2_2_ >> 1;
            auVar66._4_2_ = auVar55._4_2_ >> 1;
            auVar66._6_2_ = auVar55._6_2_ >> 1;
            auVar66._8_2_ = auVar55._8_2_ >> 1;
            auVar66._10_2_ = auVar55._10_2_ >> 1;
            auVar66._12_2_ = auVar55._12_2_ >> 1;
            auVar66._14_2_ = auVar55._14_2_ >> 1;
            auVar66 = auVar66 & _DAT_002af680;
            uVar46 = CONCAT11(auVar55[1] - auVar66[1],auVar55[0] - auVar66[0]);
            uVar47 = CONCAT13(auVar55[3] - auVar66[3],CONCAT12(auVar55[2] - auVar66[2],uVar46));
            uVar48 = CONCAT15(auVar55[5] - auVar66[5],CONCAT14(auVar55[4] - auVar66[4],uVar47));
            uVar49 = CONCAT17(auVar55[7] - auVar66[7],CONCAT16(auVar55[6] - auVar66[6],uVar48));
            auVar50._0_10_ =
                 CONCAT19(auVar55[9] - auVar66[9],CONCAT18(auVar55[8] - auVar66[8],uVar49));
            auVar50[10] = auVar55[10] - auVar66[10];
            auVar50[0xb] = auVar55[0xb] - auVar66[0xb];
            auVar52[0xc] = auVar55[0xc] - auVar66[0xc];
            auVar52._0_12_ = auVar50;
            auVar52[0xd] = auVar55[0xd] - auVar66[0xd];
            auVar54[0xe] = auVar55[0xe] - auVar66[0xe];
            auVar54._0_14_ = auVar52;
            auVar54[0xf] = auVar55[0xf] - auVar66[0xf];
            auVar66 = auVar54 & _DAT_002af690;
            auVar55._0_2_ = uVar46 >> 2;
            auVar55._2_2_ = (ushort)((uint)uVar47 >> 0x12);
            auVar55._4_2_ = (ushort)((uint6)uVar48 >> 0x22);
            auVar55._6_2_ = (ushort)((ulong)uVar49 >> 0x32);
            auVar55._8_2_ = (ushort)((unkuint10)auVar50._0_10_ >> 0x42);
            auVar55._10_2_ = auVar50._10_2_ >> 2;
            auVar55._12_2_ = auVar52._12_2_ >> 2;
            auVar55._14_2_ = auVar54._14_2_ >> 2;
            auVar55 = auVar55 & _DAT_002af690;
            cVar45 = auVar55[0] + auVar66[0];
            bVar57 = auVar55[1] + auVar66[1];
            uVar46 = CONCAT11(bVar57,cVar45);
            cVar58 = auVar55[2] + auVar66[2];
            bVar59 = auVar55[3] + auVar66[3];
            uVar47 = CONCAT13(bVar59,CONCAT12(cVar58,uVar46));
            cVar60 = auVar55[4] + auVar66[4];
            bVar61 = auVar55[5] + auVar66[5];
            uVar48 = CONCAT15(bVar61,CONCAT14(cVar60,uVar47));
            cVar62 = auVar55[6] + auVar66[6];
            bVar63 = auVar55[7] + auVar66[7];
            uVar49 = CONCAT17(bVar63,CONCAT16(cVar62,uVar48));
            cVar64 = auVar55[8] + auVar66[8];
            bVar65 = auVar55[9] + auVar66[9];
            auVar51._0_10_ = CONCAT19(bVar65,CONCAT18(cVar64,uVar49));
            auVar51[10] = auVar55[10] + auVar66[10];
            auVar51[0xb] = auVar55[0xb] + auVar66[0xb];
            auVar53[0xc] = auVar55[0xc] + auVar66[0xc];
            auVar53._0_12_ = auVar51;
            auVar53[0xd] = auVar55[0xd] + auVar66[0xd];
            auVar56[0xe] = auVar55[0xe] + auVar66[0xe];
            auVar56._0_14_ = auVar53;
            auVar56[0xf] = auVar55[0xf] + auVar66[0xf];
            auVar67[0] = (char)(uVar46 >> 4) + cVar45;
            auVar67[1] = (bVar57 >> 4) + bVar57;
            auVar67[2] = (char)(ushort)((uint)uVar47 >> 0x14) + cVar58;
            auVar67[3] = (bVar59 >> 4) + bVar59;
            auVar67[4] = (char)(ushort)((uint6)uVar48 >> 0x24) + cVar60;
            auVar67[5] = (bVar61 >> 4) + bVar61;
            auVar67[6] = (char)(ushort)((ulong)uVar49 >> 0x34) + cVar62;
            auVar67[7] = (bVar63 >> 4) + bVar63;
            auVar67[8] = (char)(ushort)((unkuint10)auVar51._0_10_ >> 0x44) + cVar64;
            auVar67[9] = (bVar65 >> 4) + bVar65;
            auVar67[10] = (char)(auVar51._10_2_ >> 4) + auVar51[10];
            auVar67[0xb] = (auVar51[0xb] >> 4) + auVar51[0xb];
            auVar67[0xc] = (char)(auVar53._12_2_ >> 4) + auVar53[0xc];
            auVar67[0xd] = (auVar53[0xd] >> 4) + auVar53[0xd];
            auVar67[0xe] = (char)(auVar56._14_2_ >> 4) + auVar56[0xe];
            auVar67[0xf] = (auVar56[0xf] >> 4) + auVar56[0xf];
            auVar55 = psadbw(auVar67 & _DAT_002af6a0,(undefined1  [16])0x0);
            lVar36 = lVar36 + auVar55._0_8_;
            lVar44 = lVar44 + auVar55._8_8_;
            lVar29 = lVar29 + 2;
          } while (lVar29 != 4);
          uVar37 = node->_numOfNeighbors;
          if ((ulong)(lVar44 + lVar36) < 2) {
            local_890 = 0;
            bVar28 = false;
          }
          else {
            if (uVar37 == 0) goto LAB_0029cb58;
            local_858 = (TDNode *)0x0;
            bVar28 = false;
            local_890 = 0;
            do {
              uVar38 = uVar26;
              if (uVar26 < 199) {
                do {
                  pbVar19 = local_818.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar37 = uVar38 + 1;
                  if ((local_6e8.super__Base_bitset<4UL>._M_w[uVar37 >> 6] >> (uVar37 & 0x3f) & 1)
                      != 0) {
                    pbVar39 = (aggregate->
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    __src_00 = pbVar39 + uVar26;
                    __src = local_818.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_890;
                    local_840 = 1L << ((byte)uVar37 & 0x3f);
                    memcpy(local_7a8,__src_00,0xc0);
                    pTVar16 = local_858;
                    lVar29 = 0;
                    do {
                      puVar4 = (ulong *)((long)&(((TDNode *)(&local_858->_bag + -5))->_name).
                                                _M_dataplus._M_p +
                                        (long)((pbVar19->super__Base_bitset<24UL>)._M_w + lVar29));
                      uVar33 = puVar4[1];
                      uVar7 = *(ulong *)(local_7a8 + lVar29 * 8 + 8);
                      *(ulong *)(local_7a8 + lVar29 * 8) =
                           *(ulong *)(local_7a8 + lVar29 * 8) & *puVar4;
                      *(ulong *)(local_7a8 + lVar29 * 8 + 8) = uVar7 & uVar33;
                      lVar29 = lVar29 + 2;
                    } while (lVar29 != 0x18);
                    pbVar39 = pbVar39 + uVar37;
                    memcpy(&local_6a0,pbVar39,0xc0);
                    lVar29 = 0;
                    do {
                      puVar4 = (ulong *)((long)&(((TDNode *)(&pTVar16->_bag + -5))->_name).
                                                _M_dataplus._M_p +
                                        (long)((pbVar19->super__Base_bitset<24UL>)._M_w + lVar29));
                      uVar33 = puVar4[1];
                      uVar7 = local_6a0.super__Base_bitset<24UL>._M_w[lVar29 + 1];
                      local_6a0.super__Base_bitset<24UL>._M_w[lVar29] =
                           local_6a0.super__Base_bitset<24UL>._M_w[lVar29] & *puVar4;
                      local_6a0.super__Base_bitset<24UL>._M_w[lVar29 + 1] = uVar7 & uVar33;
                      lVar29 = lVar29 + 2;
                    } while (lVar29 != 0x18);
                    if (local_7a8._0_8_ == local_6a0.super__Base_bitset<24UL>._M_w[0]) {
                      uVar33 = 0xffffffffffffffff;
                      do {
                        if (uVar33 == 0x16) goto LAB_0029c7cb;
                        ppbVar1 = &local_798.
                                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar33;
                        uVar7 = uVar33 + 1;
                        lVar29 = uVar33 + 2;
                        uVar33 = uVar7;
                      } while (*ppbVar1 == (pointer)local_6a0.super__Base_bitset<24UL>._M_w[lVar29])
                      ;
                      if (0x16 < uVar7) goto LAB_0029c7cb;
                    }
                    memcpy(local_7a8,__src,0xc0);
                    lVar29 = 0;
                    do {
                      lVar36 = lVar29 * 8;
                      uVar12 = *(uint *)(local_7a8 + lVar36 + 4);
                      uVar13 = *(uint *)(local_7a8 + lVar36 + 8);
                      uVar14 = *(uint *)(local_7a8 + lVar36 + 0xc);
                      lVar44 = lVar29 * 8;
                      *(uint *)(local_7a8 + lVar44) = *(uint *)(local_7a8 + lVar36) ^ 0xffffffff;
                      *(uint *)(local_7a8 + lVar44 + 4) = uVar12 ^ 0xffffffff;
                      *(uint *)(local_7a8 + lVar44 + 8) = uVar13 ^ 0xffffffff;
                      *(uint *)(local_7a8 + lVar44 + 0xc) = uVar14 ^ 0xffffffff;
                      lVar29 = lVar29 + 2;
                    } while (lVar29 != 0x18);
                    local_6f0 = local_6f0 & 0xfffffff;
                    memcpy(local_578,local_7a8,0xc0);
                    memcpy(&local_6a0,__src_00,0xc0);
                    lVar29 = 0;
                    do {
                      uVar33 = *(ulong *)(local_578 + lVar29 * 8 + 8);
                      uVar7 = local_6a0.super__Base_bitset<24UL>._M_w[lVar29 + 1];
                      local_6a0.super__Base_bitset<24UL>._M_w[lVar29] =
                           local_6a0.super__Base_bitset<24UL>._M_w[lVar29] &
                           *(ulong *)(local_578 + lVar29 * 8);
                      local_6a0.super__Base_bitset<24UL>._M_w[lVar29 + 1] = uVar7 & uVar33;
                      lVar29 = lVar29 + 2;
                    } while (lVar29 != 0x18);
                    memcpy(local_7a8,__src,0xc0);
                    lVar29 = 0;
                    do {
                      lVar36 = lVar29 * 8;
                      uVar12 = *(uint *)(local_7a8 + lVar36 + 4);
                      uVar13 = *(uint *)(local_7a8 + lVar36 + 8);
                      uVar14 = *(uint *)(local_7a8 + lVar36 + 0xc);
                      lVar44 = lVar29 * 8;
                      *(uint *)(local_7a8 + lVar44) = *(uint *)(local_7a8 + lVar36) ^ 0xffffffff;
                      *(uint *)(local_7a8 + lVar44 + 4) = uVar12 ^ 0xffffffff;
                      *(uint *)(local_7a8 + lVar44 + 8) = uVar13 ^ 0xffffffff;
                      *(uint *)(local_7a8 + lVar44 + 0xc) = uVar14 ^ 0xffffffff;
                      lVar29 = lVar29 + 2;
                    } while (lVar29 != 0x18);
                    local_6f0 = local_6f0 & 0xfffffff;
                    memcpy(local_330 + 0x30,local_7a8,0xc0);
                    memcpy(&local_4b0,pbVar39,0xc0);
                    lVar29 = 0;
                    do {
                      uVar33 = local_330[lVar29 + 0x31];
                      (&local_4b0)[lVar29] =
                           (View *)((ulong)(&local_4b0)[lVar29] & local_330[lVar29 + 0x30]);
                      auStack_4a8[lVar29] = auStack_4a8[lVar29] & uVar33;
                      lVar29 = lVar29 + 2;
                    } while (lVar29 != 0x18);
                    if ((View *)local_6a0.super__Base_bitset<24UL>._M_w[0] == local_4b0) {
                      uVar33 = 0xffffffffffffffff;
                      do {
                        if (uVar33 == 0x16) goto LAB_0029c7ac;
                        lVar36 = uVar33 + 2;
                        uVar7 = uVar33 + 1;
                        lVar29 = uVar33 + 1;
                        uVar33 = uVar7;
                      } while (local_6a0.super__Base_bitset<24UL>._M_w[lVar36] ==
                               auStack_4a8[lVar29]);
                      if (0x16 < uVar7) {
LAB_0029c7ac:
                        *(ulong *)(local_6c8 + (uVar37 >> 6) * 8) =
                             *(ulong *)(local_6c8 + (uVar37 >> 6) * 8) | local_840;
                        bVar28 = true;
                      }
                    }
                    std::bitset<200UL>::reset(&local_6e8,uVar37);
                  }
LAB_0029c7cb:
                  bVar43 = uVar38 < 0xc6;
                  uVar38 = uVar37;
                } while (bVar43);
                uVar37 = node->_numOfNeighbors;
              }
              if (bVar28) break;
              local_890 = local_890 + 1;
              local_858 = (TDNode *)&local_858[1]._bag;
            } while (local_890 < uVar37);
          }
          if (uVar37 != 0) {
            uVar38 = 0;
            uVar33 = 0;
            do {
              pbVar19 = local_818.
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((node->_neighbors).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar33] != local_860) {
                local_840 = uVar38;
                memcpy((bitset<1500UL> *)local_7a8,
                       (aggregate->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar26,0xc0);
                lVar29 = 0;
                do {
                  puVar4 = (ulong *)((long)(pbVar19->super__Base_bitset<24UL>)._M_w +
                                    lVar29 * 8 + uVar38);
                  uVar37 = puVar4[1];
                  uVar7 = *(ulong *)(local_7a8 + lVar29 * 8 + 8);
                  *(ulong *)(local_7a8 + lVar29 * 8) = *(ulong *)(local_7a8 + lVar29 * 8) & *puVar4;
                  *(ulong *)(local_7a8 + lVar29 * 8 + 8) = uVar7 & uVar37;
                  lVar29 = lVar29 + 2;
                } while (lVar29 != 0x18);
                __l._M_len = 1;
                __l._M_array = (bitset<1500UL> *)local_7a8;
                std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                          ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                           &local_6a0,__l,(allocator_type *)local_578);
                if (uVar33 == local_890 && !(bool)(~bVar28 & 1)) {
                  uVar37 = 0;
                  do {
                    pbVar19 = local_818.
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((*(ulong *)(local_6c8 + (uVar37 >> 6) * 8) >> (uVar37 & 0x3f) & 1) != 0) {
                      memcpy((bitset<1500UL> *)local_7a8,
                             (aggregate->
                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar37,0xc0);
                      _Var17 = local_6a0.super__Base_bitset<24UL>._M_w[1];
                      lVar29 = 0;
                      do {
                        p_Var3 = pbVar19[local_890].super__Base_bitset<24UL>._M_w + lVar29;
                        uVar38 = p_Var3[1];
                        uVar7 = *(ulong *)(local_7a8 + lVar29 * 8 + 8);
                        *(ulong *)(local_7a8 + lVar29 * 8) =
                             *(ulong *)(local_7a8 + lVar29 * 8) & *p_Var3;
                        *(ulong *)(local_7a8 + lVar29 * 8 + 8) = uVar7 & uVar38;
                        lVar29 = lVar29 + 2;
                      } while (lVar29 != 0x18);
                      if (local_6a0.super__Base_bitset<24UL>._M_w[1] ==
                          local_6a0.super__Base_bitset<24UL>._M_w[2]) {
                        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
                        _M_realloc_insert<std::bitset<1500ul>>
                                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>
                                    *)&local_6a0,
                                   (iterator)local_6a0.super__Base_bitset<24UL>._M_w[1],
                                   (bitset<1500UL> *)local_7a8);
                      }
                      else {
                        memcpy((void *)local_6a0.super__Base_bitset<24UL>._M_w[1],
                               (bitset<1500UL> *)local_7a8,0xc0);
                        local_6a0.super__Base_bitset<24UL>._M_w[1] = _Var17 + 0xc0;
                      }
                      std::bitset<200UL>::reset(this_00,uVar37);
                    }
                    uVar37 = uVar37 + 1;
                  } while (uVar37 != 200);
                }
                local_858 = TreeDecomposition::getRelation
                                      ((this->_td).
                                       super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,(node->_neighbors).
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start[uVar33]);
                local_7c8 = local_850.super__Base_bitset<2UL>._M_w[0];
                local_7e0 = local_850.super__Base_bitset<2UL>._M_w[1];
                local_7d0 = local_7c0.
                            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar26].
                            super__Base_bitset<2UL>._M_w[0];
                uVar37 = local_7c0.
                         super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26].super__Base_bitset<2UL>.
                         _M_w[1];
                uVar38 = node->_neighborSchema[uVar33].super__Base_bitset<2UL>._M_w[0];
                uVar7 = node->_neighborSchema[uVar33].super__Base_bitset<2UL>._M_w[1];
                local_7e8 = (local_858->_bag).super__Base_bitset<2UL>._M_w[0];
                uVar9 = (local_858->_bag).super__Base_bitset<2UL>._M_w[1];
                uVar8 = (node->_bag).super__Base_bitset<2UL>._M_w[0];
                uVar41 = (node->_bag).super__Base_bitset<2UL>._M_w[1];
                local_7f0 = local_868;
                local_7d8 = node->_id;
                std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                          (&local_830,
                           (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                           &local_6a0);
                freeVars_00.super__Base_bitset<2UL>._M_w[1] =
                     uVar7 & (uVar37 | local_7e0) | uVar41 & uVar9;
                freeVars_00.super__Base_bitset<2UL>._M_w[0] =
                     uVar38 & (local_7d0 | local_7c8) | uVar8 & local_7e8;
                local_7a8 = (undefined1  [16])
                            compileViews(this,local_858,local_7d8,&local_830,freeVars_00);
                __position_00._M_current =
                     (local_7f0->_incoming).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (local_7f0->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                              *)&local_7f0->_incoming,__position_00,
                             (pair<unsigned_long,_unsigned_long> *)local_7a8);
                }
                else {
                  (__position_00._M_current)->first = local_7a8._0_8_;
                  (__position_00._M_current)->second = local_7a8._8_8_;
                  pppVar2 = &(local_7f0->_incoming).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar2 = *pppVar2 + 1;
                }
                if (local_830.
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_830.
                                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((View *)local_6a0.super__Base_bitset<24UL>._M_w[0] != (View *)0x0) {
                  operator_delete((void *)local_6a0.super__Base_bitset<24UL>._M_w[0]);
                }
                uVar37 = node->_numOfNeighbors;
                uVar38 = local_840;
              }
              uVar33 = uVar33 + 1;
              uVar38 = uVar38 + 0xc0;
            } while (uVar33 < uVar37);
          }
        }
LAB_0029cb58:
        uVar26 = uVar26 + 1;
      } while (uVar26 != 200);
      p_Var10 = local_7f8->_M_nxt;
    }
    local_7a8._8_8_ = local_850.super__Base_bitset<2UL>._M_w[1];
    local_7a8._0_8_ = local_850.super__Base_bitset<2UL>._M_w[0];
    local_798.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
    .super__Vector_impl_data._M_start._4_4_ = *(undefined4 *)&node->_id;
    local_798.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = (int)local_860;
    iVar22 = std::
             _Hashtable<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->_viewCache)._M_h,(key_type *)local_7a8);
    if (iVar22.
        super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      pVVar23 = (View *)operator_new(0x38);
      pVVar23->_origin = (uint)node->_id;
      pVVar23->_destination = (uint)local_860;
      (pVVar23->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pVVar23->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pVVar23->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pVVar23->_fVars).super__Base_bitset<2UL>._M_w[0] = local_850.super__Base_bitset<2UL>._M_w[0];
      (pVVar23->_fVars).super__Base_bitset<2UL>._M_w[1] = local_850.super__Base_bitset<2UL>._M_w[1];
      local_6a0.super__Base_bitset<24UL>._M_w[0] = (_WordT)pVVar23;
      std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pVVar23->_aggregates,
                 (iterator)0x0,&local_868);
      __position_02._M_current =
           (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_02._M_current ==
          (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<View*,std::allocator<View*>>::_M_realloc_insert<View*const&>
                  ((vector<View*,std::allocator<View*>> *)&this->_viewList,__position_02,
                   (View **)&local_6a0);
        ppVVar42 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      else {
        *__position_02._M_current = pVVar23;
        ppVVar42 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
        (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppVVar42;
      }
      ppVVar11 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pmVar24 = std::__detail::
                _Map_base<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->_viewCache,(key_type *)local_7a8);
      *pmVar24 = (int)((ulong)((long)ppVVar42 - (long)ppVVar11) >> 3) + -1;
      uVar40 = ((long)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) - 1;
      uVar31 = 0;
    }
    else {
      pVVar23 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                super__Vector_impl_data._M_start
                [*(int *)((long)iVar22.
                                super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
                                ._M_cur + 0x20)];
      __position_01._M_current =
           (pVVar23->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_6a0.super__Base_bitset<24UL>._M_w[0] = (_WordT)pVVar23;
      if (__position_01._M_current ==
          (pVVar23->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pVVar23->_aggregates,
                   __position_01,&local_868);
        ppAVar34 = (pVVar23->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      else {
        *__position_01._M_current = local_868;
        ppAVar34 = (pVVar23->_aggregates).
                   super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
        (pVVar23->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl
        .super__Vector_impl_data._M_finish = ppAVar34;
      }
      uVar31 = ((long)ppAVar34 -
                (long)(pVVar23->_aggregates).
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) - 1;
      uVar40 = (unsigned_long)
               *(int *)((long)iVar22.
                              super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
                              ._M_cur + 0x20);
    }
    pmVar25 = std::__detail::
              _Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](local_800,&local_5a8);
    pmVar25->first = (int)uVar40;
    pmVar25->second = (int)uVar31;
    std::
    _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_5e0);
    if (local_7c0.super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7c0.
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_818.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_818.
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    uVar40 = (unsigned_long)
             *(int *)((long)iVar18.
                            super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
                            ._M_cur + 0x38);
    uVar31 = (unsigned_long)
             *(int *)((long)iVar18.
                            super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
                            ._M_cur + 0x3c);
  }
  if (local_5a8.
      super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
      .
      super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
      .
      super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
      .
      super__Head_base<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_false>
      ._M_head_impl.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5a8.
                    super__Tuple_impl<0UL,_int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
                    .
                    super__Tuple_impl<1UL,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
                    .
                    super__Tuple_impl<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
                    .
                    super__Head_base<2UL,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pVar68.second = uVar31;
  pVar68.first = uVar40;
  return pVar68;
}

Assistant:

pair<size_t,size_t> QueryCompiler::compileViews(TDNode* node, size_t destinationID,
                                   vector<prod_bitset> aggregate, var_bitset freeVars)
{
    bool print = false;
    
    /* Check if the required view has already been declared - if so reuse this one */
    cache_tuple t = make_tuple(node->_id, destinationID, aggregate, freeVars);
    auto it = _cache.find(t);
    if (it != _cache.end())
    {
        if (print) 
            DINFO("We reused an existing view. \n");      
        return it->second;
    }

    
    if (print)
    {
        DINFO("\nBeginning compileViews at node " + to_string(node->_id) + " destination "+
              to_string(destinationID) + " freeVars: " + freeVars.to_string() +
              " number of products: " + to_string(aggregate.size()) +"\n");

        std::string aggString = " ";
        size_t aggIdx = 0;
        for (size_t i = 0; i < aggregate.size(); i++) {
            const auto &prod = aggregate[aggIdx];
            for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++) {
                if (prod.test(f)) {
                    Function* func = getFunction(f);
                    aggString += "f_"+to_string(f)+"(";
                    for (size_t i = 0; i < NUM_OF_VARIABLES; i++)
                        if (func->_fVars.test(i))
                            aggString += _td->getAttribute(i)->_name;
                    aggString += ")*";
                }
            }
            aggString.pop_back();
            aggString += " + ";
            ++aggIdx;
        }
        aggString.pop_back();
        printf("%s\n", aggString.c_str());
    }
    
    vector<prod_bitset> pushDownMask(node->_numOfNeighbors);
    prod_bitset localMask, forcedLocalFunctions, remainderMask, presentFunctions;

    // Find all functions in the aggregate 
    for (size_t prod = 0; prod < aggregate.size(); prod++)
        presentFunctions |= aggregate[prod];

    for (size_t i = 0; i < NUM_OF_FUNCTIONS; i++)
    {
        if (presentFunctions[i])
        {            
            const var_bitset& fVars = _functionList[i]->_fVars;
            bool pushedDown = false;

            /*
             * Check if that function is included in the local bag
             * - if so, then we do not push it down 
             */
            if ((node->_bag & fVars) == fVars)
            {
                /* Leave it here as local computation */
                localMask.set(i);
            }
            else
            {
                /* For each child of current node */
                for (size_t c = 0; c < node->_numOfNeighbors; c++)
                {
                    /* chekc that this neighbor is not the destination */
                    if (node->_neighbors[c] != destinationID)
                    {
                        /* childSchema contains the function then push down */
                        if ((node->_neighborSchema[c] & fVars) == fVars)
                        {
                            /* push it to this child */
                            pushDownMask[c].set(i);
                            remainderMask.set(i);
                            pushedDown = true;
                            break;
                        }
                    }
                }

                if (!pushedDown)
                {
                    /* Leave it here as local computation */
                    localMask.set(i);
                    forcedLocalFunctions.set(i);
                }
            }
        }
    }
    
    vector<var_bitset> pushDownFreeVars(aggregate.size(), freeVars);
    
    std::unordered_map<prod_bitset, agg_bitset> localAggMap;


    /* 
     * For each product - split the functions into the ones that are pushed down
     * and the local functions 
     */
    for (size_t prod = 0; prod < aggregate.size(); prod++)
    {
        // Add freeVars that do not exist in local bag to pushDownFreeVars
        prod_bitset forcedLocal = aggregate[prod] & forcedLocalFunctions;
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (forcedLocal[f])
            {
                pushDownFreeVars[prod] |=
                    _functionList[f]->_fVars & ~node->_bag;
            }
        }
        
        prod_bitset localAggregate = aggregate[prod] & localMask;
        
        // add this product to localAggregates
        auto it = localAggMap.find(localAggregate);
        if (it != localAggMap.end())
        {
            it->second.set(prod);
        }
        else
        {
            localAggMap[localAggregate] = agg_bitset().set(prod);
        }
    }
  
    if (print)
    {
        size_t localAggIndex = 0;
        for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
    }


    Aggregate* agg = new Aggregate();

    /* 
     * We now computed the local aggregates and the groups of products they
     * correspond to - now we check if we can merge several products before the
     * recursion 
     */
    size_t localAggIndex = 0;
    for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
    {
        if (print)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
        
        for (size_t prod = 0; prod < NUM_OF_PRODUCTS; ++prod)
        {
            if (localAgg.second[prod])
            {
                if (print)
                    std::cout << prod << std::endl;
                
                // Push local aggregate on aggregate
                agg->_agg.push_back(localAgg.first);
                
                size_t neigh = 0;
                bool mergable = false;

                // Check if we can merge some of the products that need to be
                // computed below
                agg_bitset merges, candidate = localAgg.second;

                if (localAgg.second.count() > 1)
                {
                    for (neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
                    {
                        for (size_t other_prod = prod+1; other_prod < NUM_OF_PRODUCTS;
                             ++other_prod)
                        {
                            if (candidate[other_prod])
                            {
                                if ((aggregate[prod] & pushDownMask[neigh]) !=
                                    (aggregate[other_prod] & pushDownMask[neigh]))
                                {
                                    if ((aggregate[prod] & ~pushDownMask[neigh]) ==
                                        (aggregate[other_prod] & ~pushDownMask[neigh]))
                                    {
                                        merges.set(other_prod);
                                        mergable = true;
                                    }

                                    candidate.reset(other_prod);
                                }
                            }
                        }

                        if (mergable)
                            break;                        
                    }
                }

                // For each neighbor compile the (merged) views and push to incoming
                for (size_t n = 0; n < node->_numOfNeighbors; ++n)
                {
                    if (node->_neighbors[n] != destinationID)
                    {
                        vector<prod_bitset> childAgg =
                            {aggregate[prod] & pushDownMask[n]};
                        
                        if (mergable && n == neigh)
                        {  
                            for (size_t other = 0; other < NUM_OF_PRODUCTS; ++other)
                            {
                                if (merges[other])
                                {     
                                    /* Add mergable products to this array */
                                    childAgg.push_back(
                                        aggregate[other] & pushDownMask[n]);
                                    
                                    /* And unset for the flag in localAgg.second */
                                    localAgg.second.reset(other);
                                }
                            }
                        }

                        TDNode* neighbor = _td->getRelation(node->_neighbors[n]);

                        var_bitset neighborFreeVars =
                            ((freeVars | pushDownFreeVars[prod]) &
                             node->_neighborSchema[n]) |
                            (neighbor->_bag & node->_bag);

                        /* Recursive call for the next child */ 
                        agg->_incoming.push_back(
                             compileViews(neighbor, node->_id, childAgg, neighborFreeVars));
                    }
                }
            }
        }
    }

    /* 
     * Check here if a View with the same node, destination and freeVars exists 
     * if so then we want to append this aggregate to the exisiting view
     */
    View* view;
    view_tuple vt = make_tuple(node->_id, destinationID, freeVars);
    pair<size_t, size_t> viewAggregatePair;
    
    auto view_it = _viewCache.find(vt);
    if (view_it != _viewCache.end())
    {
        /* If the required view has already been declared, we append the
         * aggregate to this view 
         */

        view = _viewList[view_it->second];
        
        view->_aggregates.push_back(agg);

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(view_it->second, view->_aggregates.size()-1);
    }
    else
    {
        /* 
         * If the required view has not already been declared, we construct a
         * new view and the aggregate to it
         */
        view = new View(node->_id, destinationID);
        
        view->_fVars = freeVars;
        view->_aggregates.push_back(agg);

        /* Adding local view to the list of views */
        _viewList.push_back(view);

        /* Cache this view structure */
        _viewCache[vt] = _viewList.size()-1;

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(_viewList.size()-1, 0);
    }
    
    /* Adding the  view for the entire subtree to the cache */ 
    _cache[t] = viewAggregatePair;
    
    /* Return ID of this view */  
    return viewAggregatePair;    
}